

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

float * Tim_ManGetReqTimes(Tim_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int k;
  int i;
  Tim_Obj_t *pObj;
  float *pTimes;
  Tim_Man_t *p_local;
  
  local_30 = 0;
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (local_2c < p->nCos) {
      _k = p->pCos + local_2c;
      bVar2 = _k != (Tim_Obj_t *)0x0;
    }
    if ((!bVar2) || ((_k->iObj2Box < 0 && ((_k->timeReq != 1e+09 || (NAN(_k->timeReq))))))) break;
    local_2c = local_2c + 1;
  }
  iVar1 = Tim_ManPoNum(p);
  if (local_2c == iVar1) {
    p_local = (Tim_Man_t *)0x0;
  }
  else {
    iVar1 = Tim_ManCoNum(p);
    p_local = (Tim_Man_t *)malloc((long)iVar1 << 2);
    iVar1 = Tim_ManCoNum(p);
    memset(p_local,0xff,(long)iVar1 << 2);
    local_2c = 0;
    while( true ) {
      bVar2 = false;
      if (local_2c < p->nCos) {
        _k = p->pCos + local_2c;
        bVar2 = _k != (Tim_Obj_t *)0x0;
      }
      if (!bVar2) break;
      if (_k->iObj2Box < 0) {
        *(float *)((long)&p_local->vBoxes + (long)local_30 * 4) = _k->timeArr;
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    iVar1 = Tim_ManPoNum(p);
    if (local_30 != iVar1) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timMan.c"
                    ,0x1fe,"float *Tim_ManGetReqTimes(Tim_Man_t *)");
    }
  }
  return (float *)p_local;
}

Assistant:

float * Tim_ManGetReqTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i, k = 0;
    Tim_ManForEachPo( p, pObj, i )
        if ( pObj->timeReq != TIM_ETERNITY )
            break;
    if ( i == Tim_ManPoNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCoNum(p) );
    Tim_ManForEachPo( p, pObj, i )
        pTimes[k++] = pObj->timeArr;
    assert( k == Tim_ManPoNum(p) );
    return pTimes;
}